

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceInformation.cpp
# Opt level: O0

int DeviceInformation::getMaxTextureSize(void)

{
  logic_error *this;
  
  if (_maxTextureSize == -1) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this,"maxTextureSize not initialized, did you forgot to call init?");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return _maxTextureSize;
}

Assistant:

int DeviceInformation::getMaxTextureSize()
{
    if (_maxTextureSize == -1)
        throw std::logic_error("maxTextureSize not initialized, did you forgot to call init?");
    return _maxTextureSize;
}